

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::CheckData
          (CompressedSubImageTest *this,GLenum target,GLenum internalformat)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  GLubyte *pGVar3;
  undefined4 *puVar4;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_230;
  GetNameFunc local_220;
  int local_218;
  Enum<int,_2UL> local_210;
  string local_200;
  string local_1e0;
  MessageBuilder local_1b0;
  uint local_2c;
  long lStack_28;
  GLuint i;
  Functions *gl;
  GLenum internalformat_local;
  GLenum target_local;
  CompressedSubImageTest *this_local;
  
  gl._0_4_ = internalformat;
  gl._4_4_ = target;
  _internalformat_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  pGVar3 = (GLubyte *)operator_new__((ulong)this->m_reference_size);
  this->m_result = pGVar3;
  if (this->m_result == (GLubyte *)0x0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&int::typeinfo,0);
  }
  (**(code **)(lStack_28 + 0x7c8))(gl._4_4_,0,this->m_result);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"glGetCompressedTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x12b2);
  local_2c = 0;
  while( true ) {
    if (this->m_reference_size <= local_2c) {
      return true;
    }
    if (this->m_reference[local_2c] != this->m_result[local_2c]) break;
    local_2c = local_2c + 1;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_1b0,
                      (char (*) [57])"glCompressedTextureSubImage*D created texture with data ");
  DataToString_abi_cxx11_(&local_1e0,this,this->m_reference_size,this->m_reference);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1e0);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [32])" however texture contains data ");
  DataToString_abi_cxx11_(&local_200,this,this->m_reference_size,this->m_result);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_200);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [22])". Texture target was ");
  EVar6 = glu::getTextureTargetStr(gl._4_4_);
  local_220 = EVar6.m_getName;
  local_218 = EVar6.m_value;
  local_210.m_getName = local_220;
  local_210.m_value = local_218;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_210);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [26])" and internal format was ");
  EVar6 = glu::getTextureFormatStr((GLenum)gl);
  local_230.m_getName = EVar6.m_getName;
  local_230.m_value = EVar6.m_value;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_230);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [14])0x2a850ac);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  return false;
}

Assistant:

bool CompressedSubImageTest::CheckData(glw::GLenum target, glw::GLenum internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check texture content with reference. */
	m_result = new glw::GLubyte[m_reference_size];

	if (DE_NULL == m_result)
	{
		throw 0;
	}

	gl.getCompressedTexImage(target, 0, m_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");

	for (glw::GLuint i = 0; i < m_reference_size; ++i)
	{
		if (m_reference[i] != m_result[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCompressedTextureSubImage*D created texture with data "
				<< DataToString(m_reference_size, m_reference) << " however texture contains data "
				<< DataToString(m_reference_size, m_result) << ". Texture target was "
				<< glu::getTextureTargetStr(target) << " and internal format was "
				<< glu::getTextureFormatStr(internalformat) << ". Test fails." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}